

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O0

bool __thiscall RTIMUMPU9250::setGyroConfig(RTIMUMPU9250 *this)

{
  byte bVar1;
  bool bVar2;
  uchar gyroLpf;
  uchar gyroConfig;
  RTIMUMPU9250 *this_local;
  
  bVar1 = this->m_gyroLpf;
  bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                             '\x1b',this->m_gyroFsr + ((byte)((int)(uint)this->m_gyroLpf >> 3) & 3),
                             "Failed to write gyro config");
  if (bVar2) {
    bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               '\x1a',bVar1 & 7,"Failed to write gyro lpf");
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUMPU9250::setGyroConfig()
{
    unsigned char gyroConfig = m_gyroFsr + ((m_gyroLpf >> 3) & 3);
    unsigned char gyroLpf = m_gyroLpf & 7;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_GYRO_CONFIG, gyroConfig, "Failed to write gyro config"))
         return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_GYRO_LPF, gyroLpf, "Failed to write gyro lpf"))
         return false;
    return true;
}